

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender fmt::v8::detail::write_exponent<char,fmt::v8::appender>(int exp,appender it)

{
  char cVar1;
  ulong uVar2;
  uint uVar3;
  char local_2e [3];
  char local_2b;
  char local_2a;
  char local_29;
  
  if (exp < 0) {
    local_2e[0] = '-';
    buffer<char>::push_back
              ((buffer<char> *)
               it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container,local_2e);
    exp = -exp;
  }
  else {
    local_2e[1] = 0x2b;
    buffer<char>::push_back
              ((buffer<char> *)
               it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container,local_2e + 1)
    ;
  }
  uVar3 = exp;
  if (99 < (uint)exp) {
    uVar3 = (uint)exp % 100;
    uVar2 = (ulong)(((uint)exp / 100) * 2);
    if (999 < (uint)exp) {
      local_2e[2] = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                    [uVar2];
      buffer<char>::push_back
                ((buffer<char> *)
                 it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container,
                 local_2e + 2);
    }
    local_2b = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
               [uVar2 + 1];
    buffer<char>::push_back
              ((buffer<char> *)
               it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container,&local_2b);
  }
  local_2a = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
             [(ulong)uVar3 * 2];
  cVar1 = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
          [(ulong)uVar3 * 2 + 1];
  buffer<char>::push_back
            ((buffer<char> *)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container
             ,&local_2a);
  local_29 = cVar1;
  buffer<char>::push_back
            ((buffer<char> *)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container
             ,&local_29);
  return (appender)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container
  ;
}

Assistant:

FMT_CONSTEXPR auto write_exponent(int exp, It it) -> It {
  FMT_ASSERT(-10000 < exp && exp < 10000, "exponent out of range");
  if (exp < 0) {
    *it++ = static_cast<Char>('-');
    exp = -exp;
  } else {
    *it++ = static_cast<Char>('+');
  }
  if (exp >= 100) {
    const char* top = digits2(to_unsigned(exp / 100));
    if (exp >= 1000) *it++ = static_cast<Char>(top[0]);
    *it++ = static_cast<Char>(top[1]);
    exp %= 100;
  }
  const char* d = digits2(to_unsigned(exp));
  *it++ = static_cast<Char>(d[0]);
  *it++ = static_cast<Char>(d[1]);
  return it;
}